

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boosting.cc
# Opt level: O2

void predict_or_learn_adaptive<false>(boosting *o,single_learner *base,example *ec)

{
  float fVar1;
  int i;
  size_t i_00;
  float fVar2;
  float fVar3;
  float fVar4;
  
  fVar1 = ec->weight;
  if ((float)o->t < 0.0) {
    sqrtf((float)o->t);
  }
  fVar2 = merand48(&o->all->random_state);
  fVar4 = 0.0;
  fVar3 = 0.0;
  for (i_00 = 0; (long)i_00 < (long)o->N; i_00 = i_00 + 1) {
    LEARNER::learner<char,_example>::predict(base,ec,i_00);
    if (fVar2 < fVar3) break;
    fVar4 = fVar4 + (ec->pred).scalar *
                    (o->alpha).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start[i_00];
    fVar3 = fVar3 + (o->v).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start[i_00];
  }
  ec->weight = fVar1;
  ec->partial_prediction = fVar4;
  fVar2 = *(float *)(&DAT_0023baf8 + (ulong)(0.0 < fVar4) * 4);
  (ec->pred).scalar = fVar2;
  ec->loss = (float)(~-(uint)(fVar2 == (ec->l).simple.label) & (uint)fVar1);
  return;
}

Assistant:

void predict_or_learn_adaptive(boosting& o, LEARNER::single_learner& base, example& ec)
{
  label_data& ld = ec.l.simple;

  float final_prediction = 0, partial_prediction = 0;

  float s = 0;
  float v_normalization = 0, v_partial_sum = 0;
  float u = ec.weight;

  if (is_learn)
    o.t++;
  float eta = 4.f / (float)sqrtf((float)o.t);

  float stopping_point = merand48(o.all->random_state);

  for (int i = 0; i < o.N; i++)
  {
    if (is_learn)
    {
      float w = 1 / (1 + correctedExp(s));

      ec.weight = u * w;

      base.predict(ec, i);
      float z;

      z = ld.label * ec.pred.scalar;

      s += z * o.alpha[i];

      if (v_partial_sum <= stopping_point)
      {
        final_prediction += ec.pred.scalar * o.alpha[i];
      }

      partial_prediction += ec.pred.scalar * o.alpha[i];

      v_partial_sum += o.v[i];

      // update v, exp(-1) = 0.36788
      if (ld.label * partial_prediction < 0)
      {
        o.v[i] *= 0.36788f;
      }
      v_normalization += o.v[i];

      // update alpha
      o.alpha[i] += eta * z / (1 + correctedExp(s));
      if (o.alpha[i] > 2.)
        o.alpha[i] = 2;
      if (o.alpha[i] < -2.)
        o.alpha[i] = -2;

      base.learn(ec, i);
    }
    else
    {
      base.predict(ec, i);
      if (v_partial_sum <= stopping_point)
      {
        final_prediction += ec.pred.scalar * o.alpha[i];
      }
      else
      {
        // stopping at learner i
        break;
      }
      v_partial_sum += o.v[i];
    }
  }

  // normalize v vector in training
  if (is_learn)
  {
    for (int i = 0; i < o.N; i++)
    {
      if (v_normalization)
        o.v[i] /= v_normalization;
    }
  }

  ec.weight = u;
  ec.partial_prediction = final_prediction;
  ec.pred.scalar = sign(final_prediction);

  if (ld.label == ec.pred.scalar)
    ec.loss = 0.;
  else
    ec.loss = ec.weight;
}